

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O1

SectionHeader * __thiscall
Wasm::WasmBinaryReader::ReadNextSection
          (SectionHeader *__return_storage_ptr__,WasmBinaryReader *this)

{
  byte *pbVar1;
  code *pcVar2;
  uint32 uVar3;
  undefined4 uVar4;
  SectionCode SVar5;
  undefined7 uVar6;
  bool bVar7;
  uint sourceContextId;
  undefined4 *puVar8;
  FunctionBody *pFVar9;
  SectionHeader local_70;
  SectionHeader *local_48;
  undefined4 *local_40;
  Phases *local_38;
  
  local_48 = __return_storage_ptr__;
  if (this->m_pc < this->m_end) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_38 = (Phases *)&DAT_015cd718;
    local_40 = puVar8;
    do {
      ReadSectionHeader(&local_70,this);
      (this->m_currentSection).name = local_70.name;
      (this->m_currentSection).end = local_70.end;
      (this->m_currentSection).nameLength = local_70.nameLength;
      *(undefined4 *)&(this->m_currentSection).field_0x1c = local_70._28_4_;
      (this->m_currentSection).code = local_70.code;
      *(undefined7 *)&(this->m_currentSection).field_0x1 = local_70._1_7_;
      (this->m_currentSection).start = local_70.start;
      if (*(int *)(SectionInfo::All + (ulong)(this->m_currentSection).code * 0x18) != 1)
      goto LAB_00f24a55;
      pFVar9 = (this->m_funcState).body;
      if (pFVar9 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
        bVar7 = Js::Phases::IsEnabled(local_38,WasmSectionPhase);
        if (bVar7) {
LAB_00f2496a:
          Output::Print(L"Ignore this section");
          Output::Print(L"\n");
          Output::Flush();
        }
      }
      else {
        sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar9);
        if (this->m_readerState == READER_STATE_FUNCTION) {
          pFVar9 = (this->m_funcState).body;
        }
        else {
          pFVar9 = (FunctionBody *)0x0;
        }
        if ((pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
            (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar7) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar8 = 0;
        }
        bVar7 = Js::Phases::IsEnabled
                          (local_38,WasmSectionPhase,sourceContextId,
                           ((pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                           ptr)->functionId);
        if (bVar7) goto LAB_00f2496a;
      }
      pbVar1 = (this->m_currentSection).end;
      this->m_pc = pbVar1;
    } while (pbVar1 < this->m_end);
  }
  *(undefined8 *)&this->m_currentSection = 0;
  (this->m_currentSection).start = (byte *)0x0;
  (this->m_currentSection).end = (byte *)0x0;
  *(undefined8 *)&(this->m_currentSection).nameLength = 0;
  (this->m_currentSection).name = (char16 *)0x0;
  (this->m_currentSection).code = bSectLimit;
LAB_00f24a55:
  local_48->name = (this->m_currentSection).name;
  SVar5 = (this->m_currentSection).code;
  uVar6 = *(undefined7 *)&(this->m_currentSection).field_0x1;
  pbVar1 = (this->m_currentSection).start;
  uVar3 = (this->m_currentSection).nameLength;
  uVar4 = *(undefined4 *)&(this->m_currentSection).field_0x1c;
  local_48->end = (this->m_currentSection).end;
  local_48->nameLength = uVar3;
  *(undefined4 *)&local_48->field_0x1c = uVar4;
  local_48->code = SVar5;
  *(undefined7 *)&local_48->field_0x1 = uVar6;
  local_48->start = pbVar1;
  return local_48;
}

Assistant:

SectionHeader WasmBinaryReader::ReadNextSection()
{
    while (true)
    {
        if (EndOfModule())
        {
            memset(&m_currentSection, 0, sizeof(SectionHeader));
            m_currentSection.code = bSectLimit;
            return m_currentSection;
        }

        m_currentSection = ReadSectionHeader();
        if (SectionInfo::All[m_currentSection.code].flag == fSectIgnore)
        {
            TRACE_WASM_SECTION(_u("Ignore this section"));
            m_pc = m_currentSection.end;
            // Read next section
            continue;
        }

        return m_currentSection;
    }
}